

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O1

payment_method_t parse_payment_method(char *value)

{
  int iVar1;
  payment_method_t pVar2;
  
  iVar1 = strcmp(value,"0");
  if (iVar1 == 0) {
    pVar2 = PM_ON_BOARD;
  }
  else {
    iVar1 = strcmp(value,"1");
    pVar2 = PM_NOT_SET - (iVar1 == 0);
  }
  return pVar2;
}

Assistant:

payment_method_t parse_payment_method(const char *value) {
    if (strcmp(value, "0") == 0)
        return PM_ON_BOARD;
    else if (strcmp(value, "1") == 0)
        return PM_BEFOREHAND;
    else
        return PM_NOT_SET;
}